

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

C_Type * struct_union_decl(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  C_Type *pCVar1;
  C_Type *pCVar2;
  C_Node *pCVar3;
  C_Obj *pCVar4;
  C_Member *pCVar5;
  C_Type *pCVar6;
  C_Type *pCVar7;
  C_Type *pCVar8;
  _Bool _Var9;
  undefined6 uVar10;
  _Bool _Var11;
  undefined7 uVar12;
  TypeKind TVar13;
  int iVar14;
  int iVar15;
  _Bool _Var16;
  _Bool _Var17;
  undefined2 uVar18;
  int iVar19;
  undefined4 uVar20;
  _Bool _Var21;
  C_Type *ty;
  C_Token *pCVar22;
  C_Type *pCVar23;
  C_Scope *pCVar24;
  C_Token *pCVar25;
  C_Token *local_30;
  
  local_30 = tok;
  ty = C_struct_type(parser);
  pCVar22 = attribute_list(parser,tok,ty);
  if (pCVar22->kind == TK_IDENT) {
    local_30 = pCVar22->next;
    pCVar25 = pCVar22;
  }
  else {
    pCVar25 = (C_Token *)0x0;
    local_30 = pCVar22;
  }
  pCVar22 = local_30;
  if (pCVar25 == (C_Token *)0x0) {
    local_30 = C_skip(parser,local_30,"{");
    struct_members(parser,&local_30,local_30,ty);
    pCVar22 = attribute_list(parser,local_30,ty);
    *rest = pCVar22;
    pCVar23 = ty;
  }
  else {
    _Var21 = C_equal(local_30,"{");
    if (_Var21) {
      local_30 = C_skip(parser,pCVar22,"{");
      struct_members(parser,&local_30,local_30,ty);
      pCVar22 = attribute_list(parser,local_30,ty);
      *rest = pCVar22;
      pCVar23 = (C_Type *)hashmap_get2(&parser->scope->tags,pCVar25->loc,pCVar25->len);
      if (pCVar23 == (C_Type *)0x0) {
        hashmap_put2(&parser->scope->tags,pCVar25->loc,pCVar25->len,ty);
        pCVar23 = ty;
      }
      else {
        TVar13 = ty->kind;
        iVar14 = ty->size;
        iVar15 = ty->align;
        _Var16 = ty->is_unsigned;
        _Var17 = ty->is_atomic;
        uVar18 = *(undefined2 *)&ty->field_0xe;
        pCVar1 = ty->origin;
        pCVar2 = ty->base;
        pCVar22 = ty->name;
        pCVar25 = ty->name_pos;
        iVar19 = ty->array_len;
        uVar20 = *(undefined4 *)&ty->field_0x34;
        pCVar3 = ty->vla_len;
        pCVar4 = ty->vla_size;
        pCVar5 = ty->members;
        _Var21 = ty->is_flexible;
        _Var9 = ty->is_packed;
        uVar10 = *(undefined6 *)&ty->field_0x52;
        pCVar6 = ty->return_ty;
        pCVar7 = ty->params;
        _Var11 = ty->is_variadic;
        uVar12 = *(undefined7 *)&ty->field_0x69;
        pCVar8 = ty->next;
        pCVar23->vla_len = ty->vla_len;
        pCVar23->vla_size = pCVar4;
        pCVar23->members = pCVar5;
        pCVar23->is_flexible = _Var21;
        pCVar23->is_packed = _Var9;
        *(undefined6 *)&pCVar23->field_0x52 = uVar10;
        pCVar23->return_ty = pCVar6;
        pCVar23->params = pCVar7;
        pCVar23->is_variadic = _Var11;
        *(undefined7 *)&pCVar23->field_0x69 = uVar12;
        pCVar23->next = pCVar8;
        pCVar23->kind = TVar13;
        pCVar23->size = iVar14;
        pCVar23->align = iVar15;
        pCVar23->is_unsigned = _Var16;
        pCVar23->is_atomic = _Var17;
        *(undefined2 *)&pCVar23->field_0xe = uVar18;
        pCVar23->origin = pCVar1;
        pCVar23->base = pCVar2;
        pCVar23->name = pCVar22;
        pCVar23->name_pos = pCVar25;
        pCVar23->array_len = iVar19;
        *(undefined4 *)&pCVar23->field_0x34 = uVar20;
        pCVar23->vla_len = pCVar3;
      }
    }
    else {
      *rest = pCVar22;
      pCVar24 = (C_Scope *)&parser->scope;
      do {
        pCVar24 = pCVar24->next;
        if (pCVar24 == (C_Scope *)0x0) {
          pCVar23 = (C_Type *)0x0;
          break;
        }
        pCVar23 = (C_Type *)hashmap_get2(&pCVar24->tags,pCVar25->loc,pCVar25->len);
      } while (pCVar23 == (C_Type *)0x0);
      if (pCVar23 == (C_Type *)0x0) {
        ty->size = -1;
        hashmap_put2(&parser->scope->tags,pCVar25->loc,pCVar25->len,ty);
        pCVar23 = ty;
      }
    }
  }
  return pCVar23;
}

Assistant:

static C_Type *struct_union_decl(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Type *ty = C_struct_type(parser);
  tok = attribute_list(parser, tok, ty);

  // Read a tag.
  C_Token *tag = NULL;
  if (tok->kind == TK_IDENT) {
    tag = tok;
    tok = tok->next;
  }

  if (tag && !C_equal(tok, "{")) {
    *rest = tok;

    C_Type *ty2 = find_tag(parser, tag);
    if (ty2)
      return ty2;

    ty->size = -1;
    push_tag_scope(parser, tag, ty);
    return ty;
  }

  tok = C_skip(parser, tok, "{");

  // Construct a struct object.
  struct_members(parser, &tok, tok, ty);
  *rest = attribute_list(parser, tok, ty);

  if (tag) {
    // If this is a redefinition, overwrite a previous type.
    // Otherwise, register the struct type.
    C_Type *ty2 = hashmap_get2(&parser->scope->tags, tag->loc, tag->len);
    if (ty2) {
      *ty2 = *ty;
      return ty2;
    }

    push_tag_scope(parser, tag, ty);
  }

  return ty;
}